

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx2::forward_inplace(BinaryOp_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  __m256 afVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  __m256 *pafVar7;
  __m128 *pafVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [16];
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar24 [56];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar32 [64];
  __m128 afVar33;
  binary_op_pow_pack8 op;
  __m256 _b;
  binary_op_pow_pack8 local_bd;
  int local_bc;
  long local_b8;
  long local_b0;
  Mat *local_a8;
  __m256 local_a0;
  __m256 local_80 [2];
  
  afVar3 = local_80[0];
  local_a8 = bottom_top_blob;
  if (bottom_top_blob->elempack == 4) {
    p_Var2 = this->_vptr_BinaryOp_x86_avx2[-3];
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar25._0_4_ = fVar12 + *(float *)*pauVar10;
              auVar25._4_4_ = fVar12 + *(float *)((long)*pauVar10 + 4);
              auVar25._8_4_ = fVar12 + *(float *)((long)*pauVar10 + 8);
              auVar25._12_4_ = fVar12 + *(float *)((long)*pauVar10 + 0xc);
              *pauVar10 = auVar25;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 1:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar17 = vsubps_avx(*pauVar10,auVar15);
              *pauVar10 = auVar17;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 2:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar26._0_4_ = fVar12 * *(float *)*pauVar10;
              auVar26._4_4_ = fVar12 * *(float *)((long)*pauVar10 + 4);
              auVar26._8_4_ = fVar12 * *(float *)((long)*pauVar10 + 8);
              auVar26._12_4_ = fVar12 * *(float *)((long)*pauVar10 + 0xc);
              *pauVar10 = auVar26;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 3:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar27._0_4_ = fVar12 * *(float *)*pauVar10;
              auVar27._4_4_ = fVar12 * *(float *)((long)*pauVar10 + 4);
              auVar27._8_4_ = fVar12 * *(float *)((long)*pauVar10 + 8);
              auVar27._12_4_ = fVar12 * *(float *)((long)*pauVar10 + 0xc);
              *pauVar10 = auVar27;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 4:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar17 = vmaxps_avx(auVar13,*pauVar10);
              *pauVar10 = auVar17;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 5:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar17 = vminps_avx(auVar16,*pauVar10);
              *pauVar10 = auVar17;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 6:
      local_80[0][1] = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][0] = local_80[0][1];
      local_80[0][2] = local_80[0][1];
      local_80[0][3] = local_80[0][1];
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      local_80[0]._16_16_ = afVar3._16_16_;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pafVar8 = (__m128 *)
                      (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar4 = local_bc;
            do {
              auVar24 = ZEXT856(*(ulong *)(*pafVar8 + 2));
              local_a0._0_16_ = (undefined1  [16])*pafVar8;
              afVar33 = binary_op_pow_pack4::operator()
                                  ((binary_op_pow_pack4 *)&local_bd,(__m128 *)local_a0,
                                   (__m128 *)local_80);
              auVar23._0_8_ = afVar33._0_8_;
              auVar23._8_56_ = auVar24;
              afVar33 = auVar23._0_16_;
              local_a0[0] = afVar33[0];
              local_a0[1] = afVar33[1];
              local_a0[2] = afVar33[2];
              local_a0[3] = afVar33[3];
              *pafVar8 = afVar33;
              pafVar8 = pafVar8 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar17 = vsubps_avx(auVar14,*pauVar10);
              *pauVar10 = auVar17;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 8:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar17._4_4_ = fVar12;
        auVar17._0_4_ = fVar12;
        auVar17._8_4_ = fVar12;
        auVar17._12_4_ = fVar12;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar10 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar14 = vrcpps_avx(*pauVar10);
              auVar31._0_4_ = fVar12 * auVar14._0_4_;
              auVar31._4_4_ = fVar12 * auVar14._4_4_;
              auVar31._8_4_ = fVar12 * auVar14._8_4_;
              auVar31._12_4_ = fVar12 * auVar14._12_4_;
              auVar16 = vfmsub213ps_fma(*pauVar10,auVar31,auVar17);
              auVar14 = vfnmadd213ps_fma(auVar16,auVar14,auVar31);
              *pauVar10 = auVar14;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    default:
      goto switchD_00259554_default;
    }
    goto LAB_002598db;
  }
  if (bottom_top_blob->elempack == 8) {
    p_Var2 = this->_vptr_BinaryOp_x86_avx2[-3];
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar28._0_4_ = fVar12 + *(float *)*pauVar9;
              auVar28._4_4_ = fVar12 + *(float *)((long)*pauVar9 + 4);
              auVar28._8_4_ = fVar12 + *(float *)((long)*pauVar9 + 8);
              auVar28._12_4_ = fVar12 + *(float *)((long)*pauVar9 + 0xc);
              auVar28._16_4_ = fVar12 + *(float *)((long)*pauVar9 + 0x10);
              auVar28._20_4_ = fVar12 + *(float *)((long)*pauVar9 + 0x14);
              auVar28._24_4_ = fVar12 + *(float *)((long)*pauVar9 + 0x18);
              auVar28._28_4_ = fVar12 + *(float *)((long)*pauVar9 + 0x1c);
              *pauVar9 = auVar28;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 1:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar20._16_4_ = uVar1;
        auVar20._20_4_ = uVar1;
        auVar20._24_4_ = uVar1;
        auVar20._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar22 = vsubps_avx(*pauVar9,auVar20);
              *pauVar9 = auVar22;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 2:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar29._0_4_ = fVar12 * *(float *)*pauVar9;
              auVar29._4_4_ = fVar12 * *(float *)((long)*pauVar9 + 4);
              auVar29._8_4_ = fVar12 * *(float *)((long)*pauVar9 + 8);
              auVar29._12_4_ = fVar12 * *(float *)((long)*pauVar9 + 0xc);
              auVar29._16_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x10);
              auVar29._20_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x14);
              auVar29._28_36_ = in_ZMM1._28_36_;
              auVar29._24_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x18);
              in_ZMM1 = ZEXT3264(auVar29._0_32_);
              *pauVar9 = auVar29._0_32_;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 3:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar30._0_4_ = fVar12 * *(float *)*pauVar9;
              auVar30._4_4_ = fVar12 * *(float *)((long)*pauVar9 + 4);
              auVar30._8_4_ = fVar12 * *(float *)((long)*pauVar9 + 8);
              auVar30._12_4_ = fVar12 * *(float *)((long)*pauVar9 + 0xc);
              auVar30._16_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x10);
              auVar30._20_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x14);
              auVar30._28_36_ = in_ZMM1._28_36_;
              auVar30._24_4_ = fVar12 * *(float *)((long)*pauVar9 + 0x18);
              in_ZMM1 = ZEXT3264(auVar30._0_32_);
              *pauVar9 = auVar30._0_32_;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 4:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar22 = vmaxps_avx(auVar18,*pauVar9);
              *pauVar9 = auVar22;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 5:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar22 = vminps_avx(auVar21,*pauVar9);
              *pauVar9 = auVar22;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 6:
      fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][1] = fVar12;
      local_80[0][0] = fVar12;
      local_80[0][2] = fVar12;
      local_80[0][3] = fVar12;
      local_80[0][4] = fVar12;
      local_80[0][5] = fVar12;
      local_80[0][6] = fVar12;
      local_80[0][7] = fVar12;
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pafVar7 = (__m256 *)
                      (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar4 = local_bc;
            do {
              local_a0 = *pafVar7;
              binary_op_pow_pack8::operator()(&local_bd,&local_a0,local_80);
              *pafVar7 = local_a0;
              pafVar7 = pafVar7 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar22 = vsubps_avx(auVar19,*pauVar9);
              *pauVar9 = auVar22;
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 8:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar22._4_4_ = fVar12;
        auVar22._0_4_ = fVar12;
        auVar22._8_4_ = fVar12;
        auVar22._12_4_ = fVar12;
        auVar22._16_4_ = fVar12;
        auVar22._20_4_ = fVar12;
        auVar22._24_4_ = fVar12;
        auVar22._28_4_ = fVar12;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar11 = iVar6;
            do {
              auVar19 = vrcpps_avx(*pauVar9);
              auVar32._0_4_ = fVar12 * auVar19._0_4_;
              auVar32._4_4_ = fVar12 * auVar19._4_4_;
              auVar32._8_4_ = fVar12 * auVar19._8_4_;
              auVar32._12_4_ = fVar12 * auVar19._12_4_;
              auVar32._16_4_ = fVar12 * auVar19._16_4_;
              auVar32._20_4_ = fVar12 * auVar19._20_4_;
              auVar32._28_36_ = in_ZMM3._28_36_;
              auVar32._24_4_ = fVar12 * auVar19._24_4_;
              auVar21 = auVar32._0_32_;
              in_ZMM3 = ZEXT3264(auVar21);
              auVar17 = vfmsub213ps_fma(*pauVar9,auVar21,auVar22);
              auVar17 = vfnmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar21);
              *pauVar9 = ZEXT1632(auVar17);
              pauVar9 = pauVar9 + 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    default:
      goto switchD_00259554_default;
    }
LAB_002598db:
    iVar4 = 0;
  }
  else {
switchD_00259554_default:
    iVar4 = BinaryOp::forward_inplace
                      ((BinaryOp *)
                       ((long)&this->_vptr_BinaryOp_x86_avx2 +
                       (long)this->_vptr_BinaryOp_x86_avx2[-3]),bottom_top_blob,opt);
  }
  return iVar4;
}

Assistant:

int BinaryOp_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}